

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O2

int qc_file_close(QcFile *file)

{
  int iVar1;
  
  if (file != (QcFile *)0x0) {
    iVar1 = close(file->filedes);
    if (iVar1 == 0) {
      free(file);
      iVar1 = 0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x52,"file close failed");
      iVar1 = -1;
    }
    return iVar1;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
          ,0x4e);
  __assert_fail("file",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x4e,"int qc_file_close(QcFile *)");
}

Assistant:

int qc_file_close(QcFile *file)
{
    qc_assert(file);

    if(0 != close(file->filedes))
    {
        qc_error("file close failed");
        return -1;
    }

    qc_free(file);
    return 0;
}